

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BoxCoordinatesMode::MergeFrom
          (BoxCoordinatesMode *this,BoxCoordinatesMode *from)

{
  BoxCoordinatesMode_Coordinates BVar1;
  LogMessage *other;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  BoxCoordinatesMode *local_18;
  BoxCoordinatesMode *from_local;
  BoxCoordinatesMode *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x563d);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  BVar1 = _internal_boxmode(local_18);
  if (BVar1 != BoxCoordinatesMode_Coordinates_CORNERS_HEIGHT_FIRST) {
    BVar1 = _internal_boxmode(local_18);
    _internal_set_boxmode(this,BVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BoxCoordinatesMode::MergeFrom(const BoxCoordinatesMode& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BoxCoordinatesMode)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_boxmode() != 0) {
    _internal_set_boxmode(from._internal_boxmode());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}